

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

deUint32 __thiscall
sglr::ReferenceContext::checkFramebufferStatus(ReferenceContext *this,deUint32 target)

{
  int iVar1;
  TexTarget target_00;
  uint uVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  ChannelOrder CVar6;
  CubeFace CVar7;
  deUint32 dVar8;
  Texture *pTVar9;
  Renderbuffer *pRVar10;
  long lVar11;
  TestError *this_00;
  long lVar12;
  ulong uVar13;
  int iVar14;
  byte bVar15;
  bool bVar16;
  int iVar17;
  long lVar18;
  bool bVar19;
  ConstPixelBufferAccess local_58;
  
  if ((target - 0x8ca8 < 2) || (target == 0x8d40)) {
    lVar12 = 0x3f40;
    if (target != 0x8d40) {
      lVar12 = (ulong)(target == 0x8ca9) * 8 + 0x3f38;
    }
    lVar12 = *(long *)((long)(this->m_defaultColorbuffer).m_access.super_ConstPixelBufferAccess.
                             m_size.m_data + lVar12 + -0x70);
    if (lVar12 == 0) {
      dVar8 = 0x8cd5;
    }
    else {
      iVar17 = -1;
      bVar15 = 1;
      bVar5 = true;
      bVar16 = false;
      iVar14 = -1;
      for (lVar18 = 0; lVar18 != 0x3c; lVar18 = lVar18 + 0x14) {
        iVar1 = *(int *)(lVar12 + 0x10 + lVar18);
        if (iVar1 == 0) {
          pRVar10 = rc::ObjectManager<sglr::rc::Renderbuffer>::find
                              (&this->m_renderbuffers,*(deUint32 *)(lVar12 + 0x14 + lVar18));
          if (pRVar10 == (Renderbuffer *)0x0) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"renderbuffer",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                       ,0x8bd);
            goto LAB_01525503;
          }
          iVar1 = (pRVar10->m_data).m_size.m_data[0];
          iVar3 = (pRVar10->m_data).m_size.m_data[1];
          CVar6 = (pRVar10->m_data).m_format.order;
LAB_0152533f:
          if (((iVar3 < 1) || (iVar1 < 1)) || (bVar16)) {
            bVar15 = bVar15 & (iVar3 == iVar17 && iVar1 == iVar14);
          }
          else {
            bVar16 = true;
            iVar14 = iVar1;
            iVar17 = iVar3;
          }
          switch(CVar6) {
          case R:
          case RG:
          case RGB:
          case RGBA:
          case sRGB:
          case sRGBA:
            bVar19 = lVar18 == 0;
            break;
          default:
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Unsupported attachment channel order",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                       ,0x8f0);
LAB_01525503:
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          case D:
            bVar19 = lVar18 == 0x14;
            break;
          case S:
            bVar19 = lVar18 == 0x28;
            break;
          case DS:
            bVar19 = lVar18 != 0;
          }
          bVar5 = (bool)(bVar5 & bVar19);
        }
        else if (iVar1 != 2) {
          if (iVar1 != 1) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"attachment.type == Framebuffer::ATTACHMENTTYPE_LAST",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                       ,0x8c5);
            goto LAB_01525503;
          }
          pTVar9 = rc::ObjectManager<sglr::rc::Texture>::find
                             (&this->m_textures,*(deUint32 *)(lVar12 + 0x14 + lVar18));
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_58);
          if (pTVar9 == (Texture *)0x0) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"texture",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                       ,0x885);
            goto LAB_01525503;
          }
          target_00 = *(TexTarget *)(lVar12 + 0x18 + lVar18);
          if (target_00 == TEXTARGET_2D) {
            uVar2 = *(uint *)(lVar12 + 0x1c + lVar18);
joined_r0x0152528e:
            uVar13 = (ulong)uVar2;
            if ((uVar13 < 0xe) &&
               (lVar4._0_4_ = (&pTVar9[1].super_NamedObject)[uVar13].m_name,
               lVar4._4_4_ = (&pTVar9[1].super_NamedObject)[uVar13].m_refCount, lVar4 != 0)) {
              lVar11 = (long)&pTVar9->super_NamedObject + uVar13 * 0x28;
LAB_0152530e:
              local_58.m_data = *(void **)(lVar11 + 0x160);
              local_58.m_format = *(TextureFormat *)(lVar11 + 0x140);
              local_58.m_size.m_data._0_8_ = *(undefined8 *)(lVar11 + 0x148);
              local_58._16_8_ = *(undefined8 *)(lVar11 + 0x150);
              local_58.m_pitch.m_data._4_8_ = *(undefined8 *)(lVar11 + 0x158);
            }
          }
          else {
            if (TEXTARGET_CUBE_MAP_NEGATIVE_Z < target_00) {
              if (((target_00 != TEXTARGET_CUBE_MAP_ARRAY) && (target_00 != TEXTARGET_3D)) &&
                 (target_00 != TEXTARGET_2D_ARRAY)) {
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,"Framebuffer attached to a texture but no valid target specified"
                           ,(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                           ,0x8b4);
                goto LAB_01525503;
              }
              uVar2 = *(uint *)(lVar12 + 0x1c + lVar18);
              goto joined_r0x0152528e;
            }
            CVar7 = texTargetToFace(target_00);
            if (CUBEFACE_POSITIVE_Z < CVar7) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,(char *)0x0,"de::inBounds<int>(face, 0, tcu::CUBEFACE_LAST)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                         ,0x896);
              goto LAB_01525503;
            }
            uVar13 = (ulong)*(uint *)(lVar12 + 0x1c + lVar18);
            if ((uVar13 < 0xe) &&
               (lVar11._0_4_ = (&pTVar9[(ulong)CVar7 * 0xe + 1].super_NamedObject)[uVar13].m_name,
               lVar11._4_4_ = (&pTVar9[(ulong)CVar7 * 0xe + 1].super_NamedObject)[uVar13].m_refCount
               , lVar11 != 0)) {
              lVar11 = (long)&pTVar9[(ulong)CVar7 * 0xe].super_NamedObject + uVar13 * 0x28;
              goto LAB_0152530e;
            }
          }
          CVar6 = local_58.m_format.order;
          iVar1 = local_58.m_size.m_data[0];
          iVar3 = local_58.m_size.m_data[1];
          goto LAB_0152533f;
        }
      }
      dVar8 = 0x8cd6;
      if (bVar5) {
        dVar8 = 0x8cd7;
        if (bVar16) {
          dVar8 = ((byte)~bVar15 & 1) * 4 + 0x8cd5;
        }
      }
    }
  }
  else {
    dVar8 = 0;
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
      dVar8 = 0;
    }
  }
  return dVar8;
}

Assistant:

deUint32 ReferenceContext::checkFramebufferStatus (deUint32 target)
{
	RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
				target != GL_DRAW_FRAMEBUFFER	&&
				target != GL_READ_FRAMEBUFFER, GL_INVALID_ENUM, 0);

	// Select binding point.
	rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;

	// Default framebuffer is always complete.
	if (!framebufferBinding)
		return GL_FRAMEBUFFER_COMPLETE;

	int		width				= -1;
	int		height				= -1;
	bool	hasAttachment		= false;
	bool	attachmentComplete	= true;
	bool	dimensionsOk		= true;

	for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
	{
		const Framebuffer::Attachment&	attachment			= framebufferBinding->getAttachment((Framebuffer::AttachmentPoint)point);
		int								attachmentWidth		= 0;
		int								attachmentHeight	= 0;
		tcu::TextureFormat				attachmentFormat;

		if (attachment.type == Framebuffer::ATTACHMENTTYPE_TEXTURE)
		{
			const Texture*					texture	= m_textures.find(attachment.name);
			tcu::ConstPixelBufferAccess		level;
			TCU_CHECK(texture);

			if (attachment.texTarget == Framebuffer::TEXTARGET_2D)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_2D);
				const Texture2D* tex2D = static_cast<const Texture2D*>(texture);

				if (tex2D->hasLevel(attachment.level))
					level = tex2D->getLevel(attachment.level);
			}
			else if (deInRange32(attachment.texTarget, Framebuffer::TEXTARGET_CUBE_MAP_POSITIVE_X,
													   Framebuffer::TEXTARGET_CUBE_MAP_NEGATIVE_Z))
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_CUBE_MAP);

				const TextureCube*	texCube	= static_cast<const TextureCube*>(texture);
				const tcu::CubeFace	face	= texTargetToFace(attachment.texTarget);
				TCU_CHECK(de::inBounds<int>(face, 0, tcu::CUBEFACE_LAST));

				if (texCube->hasFace(attachment.level, face))
					level = texCube->getFace(attachment.level, face);
			}
			else if (attachment.texTarget == Framebuffer::TEXTARGET_2D_ARRAY)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_2D_ARRAY);
				const Texture2DArray* tex2DArr = static_cast<const Texture2DArray*>(texture);

				if (tex2DArr->hasLevel(attachment.level))
					level = tex2DArr->getLevel(attachment.level); // \note Slice doesn't matter here.
			}
			else if (attachment.texTarget == Framebuffer::TEXTARGET_3D)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_3D);
				const Texture3D* tex3D = static_cast<const Texture3D*>(texture);

				if (tex3D->hasLevel(attachment.level))
					level = tex3D->getLevel(attachment.level); // \note Slice doesn't matter here.
			}
			else if (attachment.texTarget == Framebuffer::TEXTARGET_CUBE_MAP_ARRAY)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_CUBE_MAP_ARRAY);
				const TextureCubeArray* texCubeArr = static_cast<const TextureCubeArray*>(texture);

				if (texCubeArr->hasLevel(attachment.level))
					level = texCubeArr->getLevel(attachment.level); // \note Slice doesn't matter here.
			}
			else
				TCU_FAIL("Framebuffer attached to a texture but no valid target specified");

			attachmentWidth		= level.getWidth();
			attachmentHeight	= level.getHeight();
			attachmentFormat	= level.getFormat();
		}
		else if (attachment.type == Framebuffer::ATTACHMENTTYPE_RENDERBUFFER)
		{
			const Renderbuffer* renderbuffer = m_renderbuffers.find(attachment.name);
			TCU_CHECK(renderbuffer);

			attachmentWidth		= renderbuffer->getWidth();
			attachmentHeight	= renderbuffer->getHeight();
			attachmentFormat	= renderbuffer->getFormat();
		}
		else
		{
			TCU_CHECK(attachment.type == Framebuffer::ATTACHMENTTYPE_LAST);
			continue; // Skip rest of checks.
		}

		if (!hasAttachment && attachmentWidth > 0 && attachmentHeight > 0)
		{
			width			= attachmentWidth;
			height			= attachmentHeight;
			hasAttachment	= true;
		}
		else if (attachmentWidth != width || attachmentHeight != height)
			dimensionsOk = false;

		// Validate attachment point compatibility.
		switch (attachmentFormat.order)
		{
			case TextureFormat::R:
			case TextureFormat::RG:
			case TextureFormat::RGB:
			case TextureFormat::RGBA:
			case TextureFormat::sRGB:
			case TextureFormat::sRGBA:
				if (point != Framebuffer::ATTACHMENTPOINT_COLOR0)
					attachmentComplete = false;
				break;

			case TextureFormat::D:
				if (point != Framebuffer::ATTACHMENTPOINT_DEPTH)
					attachmentComplete = false;
				break;

			case TextureFormat::S:
				if (point != Framebuffer::ATTACHMENTPOINT_STENCIL)
					attachmentComplete = false;
				break;

			case TextureFormat::DS:
				if (point != Framebuffer::ATTACHMENTPOINT_DEPTH &&
					point != Framebuffer::ATTACHMENTPOINT_STENCIL)
					attachmentComplete = false;
				break;

			default:
				TCU_FAIL("Unsupported attachment channel order");
		}
	}

	if (!attachmentComplete)
		return GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT;
	else if (!hasAttachment)
		return GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT;
	else if (!dimensionsOk)
		return GL_FRAMEBUFFER_INCOMPLETE_DIMENSIONS;
	else
		return GL_FRAMEBUFFER_COMPLETE;
}